

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O1

int pool_bulk_insert(StringPool *pool,xmlHashTablePtr hash,size_t num)

{
  xmlChar xVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  xmlHashTablePtr pxVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  long *plVar11;
  ulong uVar12;
  ulong unaff_RBP;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  xmlChar tmp_key [1];
  xmlChar *str [3];
  undefined1 local_81;
  ulong local_80;
  long local_78 [4];
  xmlHashTablePtr local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  StringPool *local_38;
  
  local_78[3] = pool->index;
  local_50 = num;
  if (num == 0 || pool->num_strings <= (ulong)local_78[3]) {
    local_80 = 0;
  }
  else {
    local_80 = 0;
    local_48 = 0;
    local_38 = pool;
    local_58 = hash;
    do {
      do {
        local_40 = unaff_RBP;
        uVar12 = pool->num_keys;
        if (uVar12 != 0) {
          uVar15 = 0;
          do {
            xVar1 = pool->id;
            uVar6 = rng_state_1 ^ rng_state_0;
            uVar14 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
            uVar16 = (rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 << 5) * 5 & 0x3f;
            uVar12 = (ulong)uVar16 + 1;
            uVar6 = (uVar6 << 0xd | uVar6 >> 0x13) ^ uVar14;
            rng_state_0 = uVar6 << 9 ^ (uVar14 << 0x1a | uVar14 >> 6) ^ uVar6;
            rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
            lVar8 = (*_xmlMalloc)(uVar16 + 2);
            uVar9 = 0;
            uVar6 = rng_state_1;
            uVar13 = rng_state_0;
            do {
              uVar2 = (uVar13 * -0x61c88645 >> 0x1b | uVar13 * -0x3910c8a0) * 5;
              uVar6 = uVar6 ^ uVar13;
              uVar13 = (uVar13 << 0x1a | uVar13 >> 6) ^ uVar6 << 9 ^ uVar6;
              uVar6 = uVar6 << 0xd | uVar6 >> 0x13;
              *(char *)(lVar8 + uVar9) =
                   ((char)uVar2 - ((char)(uVar2 / 0x1a) * '\x19' + (char)(uVar2 / 0x1a))) + 'a';
              uVar9 = uVar9 + 1;
            } while (uVar12 != uVar9);
            uVar9 = (ulong)((uVar14 * -0x61c88645 >> 0x1b | uVar14 * -0x3910c8a0) * 5) % uVar12;
            rng_state_0 = uVar13;
            rng_state_1 = uVar6;
            *(xmlChar *)(lVar8 + uVar9) = xVar1;
            *(undefined1 *)(lVar8 + uVar12) = 0;
            if (2 < uVar16) {
              uVar6 = uVar6 ^ uVar13;
              rng_state_0 = uVar6 << 9 ^ (uVar13 << 0x1a | uVar13 >> 6) ^ uVar6;
              rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
              if ((uVar13 * 0x1e3779bb & 0x18000000) != 0) {
                uVar6 = rng_state_0 * -0x61c88645;
                uVar14 = rng_state_0 * -0x3910c8a0;
                uVar13 = rng_state_1 ^ rng_state_0;
                rng_state_0 = uVar13 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar13;
                rng_state_1 = uVar13 << 0xd | uVar13 >> 0x13;
                uVar6 = ((uVar6 >> 0x1b | uVar14) * 5) % (uVar16 - 2);
                uVar13 = uVar6 + 1;
                uVar6 = uVar6 + 2;
                if (uVar13 < (uint)uVar9) {
                  uVar6 = uVar13;
                }
                *(undefined1 *)(lVar8 + (ulong)uVar6) = 0x3a;
              }
            }
            local_78[uVar15] = lVar8;
            uVar15 = uVar15 + 1;
            uVar12 = local_38->num_keys;
            pool = local_38;
          } while (uVar15 < uVar12);
        }
        pxVar5 = local_58;
        lVar4 = local_78[2];
        lVar3 = local_78[1];
        lVar8 = local_78[0];
        if (uVar12 == 3) {
          uVar6 = xmlHashAddEntry3(local_58,local_78[0],local_78[1],local_78[2],&local_81);
          if (uVar6 == 0) {
            iVar7 = xmlHashUpdateEntry3(pxVar5,lVar8,lVar3,lVar4,lVar8,0);
            goto LAB_001039ac;
          }
LAB_00103988:
          unaff_RBP = (ulong)uVar6;
        }
        else {
          if (uVar12 == 2) {
            uVar6 = xmlHashAddEntry2(local_58,local_78[0],local_78[1],&local_81);
            if (uVar6 != 0) goto LAB_00103988;
            iVar7 = xmlHashUpdateEntry2(pxVar5,lVar8,lVar3,lVar8,0);
          }
          else {
            unaff_RBP = local_40;
            if (uVar12 != 1) goto LAB_001039c1;
            uVar6 = xmlHashAddEntry(local_58,local_78[0],&local_81);
            if (uVar6 != 0) goto LAB_00103988;
            iVar7 = xmlHashUpdateEntry(pxVar5,lVar8,lVar8,0);
          }
LAB_001039ac:
          local_80 = (ulong)((uint)local_80 | -(uint)(iVar7 != 0));
          unaff_RBP = 0;
        }
LAB_001039c1:
        if ((int)unaff_RBP == 0) break;
        if (pool->num_keys != 0) {
          uVar12 = 0;
          do {
            (*_xmlFree)(local_78[uVar12]);
            uVar12 = uVar12 + 1;
          } while (uVar12 < pool->num_keys);
        }
      } while ((int)unaff_RBP != 0);
      sVar10 = pool->num_keys;
      if (sVar10 != 0) {
        plVar11 = local_78;
        do {
          pool->strings[local_78[3]] = (xmlChar *)*plVar11;
          local_78[3] = local_78[3] + 1;
          plVar11 = plVar11 + 1;
          sVar10 = sVar10 - 1;
        } while (sVar10 != 0);
      }
    } while (((ulong)local_78[3] < pool->num_strings) &&
            (local_48 = local_48 + 1, local_48 < local_50));
  }
  pool->index = local_78[3];
  return (int)local_80;
}

Assistant:

static int
pool_bulk_insert(StringPool *pool, xmlHashTablePtr hash, size_t num) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar *str[3];
        size_t k;

        while (1) {
            xmlChar tmp_key[1];
            int res;

            for (k = 0; k < pool->num_keys; k++)
                str[k] = gen_random_string(pool->id);

            switch (pool->num_keys) {
                case 1:
                    res = xmlHashAddEntry(hash, str[0], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry(hash, str[0], str[0], NULL) != 0)
                        ret = -1;
                    break;
                case 2:
                    res = xmlHashAddEntry2(hash, str[0], str[1], tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry2(hash, str[0], str[1], str[0],
                                            NULL) != 0)
                        ret = -1;
                    break;
                case 3:
                    res = xmlHashAddEntry3(hash, str[0], str[1], str[2],
                                           tmp_key);
                    if (res == 0 &&
                        xmlHashUpdateEntry3(hash, str[0], str[1], str[2],
                                            str[0], NULL) != 0)
                        ret = -1;
                    break;
            }

            if (res == 0)
                break;
            for (k = 0; k < pool->num_keys; k++)
                xmlFree(str[k]);
        }

        for (k = 0; k < pool->num_keys; k++)
            pool->strings[i++] = str[k];
    }

    pool->index = i;
    return ret;
}